

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall Token::SetRegex(Token *this,RegexPattern *pattern,Parser *parser)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Parser *parser_local;
  RegexPattern *pattern_local;
  Token *this_local;
  
  if (parser == (Parser *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x2d,"(parser)","parser");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pattern != (RegexPattern *)0x0) {
    Parser::RegisterRegexPattern(parser,pattern);
  }
  (this->loc).filename.data_ = (char *)pattern;
  (this->loc).field_1.field_0.last_column = 0x8e;
  return tkRegExp;
}

Assistant:

tokens Token::SetRegex(UnifiedRegex::RegexPattern *const pattern, Parser *const parser)
{
    Assert(parser);

    if(pattern)
        parser->RegisterRegexPattern(pattern);
    this->u.pattern = pattern;
    return tk = tkRegExp;
}